

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O2

int __thiscall
Protocol::MQTT::V5::Property<Protocol::MQTT::Common::DynamicStringPair>::clone
          (Property<Protocol::MQTT::Common::DynamicStringPair> *this,__fn *__fn,void *__child_stack,
          int __flags,void *__arg,...)

{
  byte bVar1;
  Property<Protocol::MQTT::Common::DynamicStringPair> *this_00;
  DynamicStringPair local_44;
  
  this_00 = (Property<Protocol::MQTT::Common::DynamicStringPair> *)operator_new(0x48);
  bVar1 = (this->super_PropertyBase).type;
  Common::DynamicStringPair::DynamicStringPair
            (&local_44,(DynamicStringPair *)&(this->super_PropertyBase).field_0x19);
  Property(this_00,(uint)bVar1,&local_44,true);
  Common::DynamicStringPair::~DynamicStringPair(&local_44);
  return (int)this_00;
}

Assistant:

PropertyBase * clone() const { return new Property((PropertyType)type, value, true); }